

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.h
# Opt level: O2

Expression_node * __thiscall
lossless_neural_sound::expression_compiler::expression::Product::get_derivative_implementation
          (Product *this,Arena *arena,Nodes *nodes,Variable *variable)

{
  Expression_node *pEVar1;
  size_t i;
  ulong uVar2;
  vector<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
  factors;
  vector<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
  current_factors;
  vector<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
  terms;
  _Vector_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
  local_88;
  _Vector_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
  local_70;
  _Vector_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
  local_58;
  Expression_node *local_38;
  
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Balanced_tree<lossless_neural_sound::expression_compiler::expression::Product>::
  visit_leaves<lossless_neural_sound::expression_compiler::expression::Product::get_derivative_implementation(lossless_neural_sound::expression_compiler::Arena&,lossless_neural_sound::expression_compiler::expression::Nodes&,lossless_neural_sound::expression_compiler::expression::Variable_const*)const::_lambda(lossless_neural_sound::expression_compiler::expression::Expression_node_const*)_1_>
            (&this->
              super_Balanced_tree<lossless_neural_sound::expression_compiler::expression::Product>,
             (vector<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
              *)&local_88);
  local_58._M_impl.super__Vector_impl_data._M_start = (Expression_node **)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
  ::reserve((vector<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
             *)&local_58,
            (long)local_88._M_impl.super__Vector_impl_data._M_finish -
            (long)local_88._M_impl.super__Vector_impl_data._M_start >> 3);
  std::
  vector<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
  ::vector((vector<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
            *)&local_70,
           (vector<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
            *)&local_88);
  for (uVar2 = 0;
      uVar2 < (ulong)((long)local_88._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_88._M_impl.super__Vector_impl_data._M_start >> 3);
      uVar2 = uVar2 + 1) {
    pEVar1 = Expression_node::get_derivative
                       (local_88._M_impl.super__Vector_impl_data._M_start[uVar2],arena,nodes,
                        variable);
    local_70._M_impl.super__Vector_impl_data._M_start[uVar2] = pEVar1;
    local_38 = make(arena,nodes,local_70._M_impl.super__Vector_impl_data._M_start,
                    (long)local_70._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_70._M_impl.super__Vector_impl_data._M_start >> 3);
    std::
    vector<lossless_neural_sound::expression_compiler::expression::Expression_node_const*,std::allocator<lossless_neural_sound::expression_compiler::expression::Expression_node_const*>>
    ::emplace_back<lossless_neural_sound::expression_compiler::expression::Expression_node_const*>
              ((vector<lossless_neural_sound::expression_compiler::expression::Expression_node_const*,std::allocator<lossless_neural_sound::expression_compiler::expression::Expression_node_const*>>
                *)&local_58,&local_38);
    local_70._M_impl.super__Vector_impl_data._M_start[uVar2] =
         local_88._M_impl.super__Vector_impl_data._M_start[uVar2];
  }
  pEVar1 = Sum::make(arena,nodes,local_58._M_impl.super__Vector_impl_data._M_start,
                     (long)local_58._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_58._M_impl.super__Vector_impl_data._M_start >> 3);
  std::
  _Vector_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
  ::~_Vector_base(&local_70);
  std::
  _Vector_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
  ::~_Vector_base(&local_58);
  std::
  _Vector_base<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*,_std::allocator<const_lossless_neural_sound::expression_compiler::expression::Expression_node_*>_>
  ::~_Vector_base(&local_88);
  return pEVar1;
}

Assistant:

virtual const Expression_node *get_derivative_implementation(
        Arena &arena, Nodes &nodes, const Variable *variable) const override
    {
        std::vector<const Expression_node *> factors;
        visit_leaves([&](const Expression_node *factor)
                     {
                         factors.push_back(factor);
                     });
        std::vector<const Expression_node *> terms;
        terms.reserve(factors.size());
        auto current_factors = factors;
        for(std::size_t i = 0; i < factors.size(); i++)
        {
            current_factors[i] = factors[i]->get_derivative(arena, nodes, variable);
            terms.push_back(make(arena, nodes, current_factors.data(), current_factors.size()));
            current_factors[i] = factors[i];
        }
        return Sum::make(arena, nodes, terms.data(), terms.size());
    }